

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O2

int __thiscall Fl_Menu_::copy(Fl_Menu_ *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  int iVar2;
  int extraout_EAX;
  size_t __n;
  Fl_Menu_Item *m;
  ulong uVar3;
  void **ppvVar4;
  bool bVar5;
  
  iVar2 = Fl_Menu_Item::size((Fl_Menu_Item *)dst);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  __n = SUB168(auVar1 * ZEXT816(0x38),0);
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x38),8) == 0) {
    uVar3 = __n;
  }
  m = (Fl_Menu_Item *)operator_new__(uVar3);
  memcpy(m,dst,__n);
  menu(this,m);
  this->alloc = '\x01';
  if (src != (EVP_PKEY_CTX *)0x0) {
    ppvVar4 = &m->user_data_;
    while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
      if ((Fl_Callback *)ppvVar4[-1] != (Fl_Callback *)0x0) {
        *ppvVar4 = src;
      }
      ppvVar4 = ppvVar4 + 7;
    }
  }
  return extraout_EAX;
}

Assistant:

void Fl_Menu_::copy(const Fl_Menu_Item* m, void* ud) {
  int n = m->size();
  Fl_Menu_Item* newMenu = new Fl_Menu_Item[n];
  memcpy(newMenu, m, n*sizeof(Fl_Menu_Item));
  menu(newMenu);
  alloc = 1; // make destructor free array, but not strings
  // for convenience, provide way to change all the user data pointers:
  if (ud) for (; n--;) {
    if (newMenu->callback_) newMenu->user_data_ = ud;
    newMenu++;
  }
}